

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O1

void __thiscall hmac_hash::SHA256::transform(SHA256 *this,uint8_t *message,size_t block_nb)

{
  undefined8 uVar1;
  uint uVar2;
  long lVar3;
  size_t sVar4;
  int iVar5;
  uint8_t *puVar6;
  uint uVar7;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  int aiStack_154 [5];
  uint local_140 [68];
  
  if (block_nb != 0) {
    puVar6 = message + 3;
    sVar4 = 0;
    do {
      lVar3 = 0;
      do {
        uVar2 = *(uint *)(puVar6 + lVar3 * 4 + -3);
        local_140[lVar3 + 2] =
             uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x10);
      lVar3 = 0x10;
      do {
        uVar2 = local_140[lVar3];
        uVar7 = *(uint *)((long)&local_178 + lVar3 * 4 + 4);
        local_140[lVar3 + 2] =
             (uVar2 >> 10 ^ (uVar2 << 0xd | uVar2 >> 0x13) ^ (uVar2 << 0xf | uVar2 >> 0x11)) +
             aiStack_154[lVar3] + *(int *)((long)&local_178 + lVar3 * 4) +
             (uVar7 >> 3 ^ (uVar7 << 0xe | uVar7 >> 0x12) ^ (uVar7 << 0x19 | uVar7 >> 7));
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x40);
      local_178 = *(undefined8 *)this->m_h;
      uStack_170 = *(undefined8 *)(this->m_h + 2);
      local_168 = *(undefined8 *)(this->m_h + 4);
      uVar1 = *(undefined8 *)(this->m_h + 6);
      uStack_160 = uVar1;
      uStack_160._4_4_ = (uint)((ulong)uVar1 >> 0x20);
      local_168._4_4_ = (uint)((ulong)local_168 >> 0x20);
      uStack_160._0_4_ = (uint)uVar1;
      local_178._4_4_ = (uint)((ulong)local_178 >> 0x20);
      uStack_170._4_4_ = (uint)((ulong)uStack_170 >> 0x20);
      lVar3 = 0;
      do {
        uVar2 = (uint)uStack_170;
        uStack_170._0_4_ = local_178._4_4_;
        local_178._4_4_ = (uint)local_178;
        uVar7 = (uint)uStack_160;
        uStack_160._0_4_ = local_168._4_4_;
        local_168._4_4_ = (uint)local_168;
        iVar5 = ((local_168._4_4_ << 7 | local_168._4_4_ >> 0x19) ^
                (local_168._4_4_ << 0x15 | local_168._4_4_ >> 0xb) ^
                (local_168._4_4_ << 0x1a | local_168._4_4_ >> 6)) + uStack_160._4_4_ +
                *(int *)((long)&sha256_k + lVar3) +
                (((uint)uStack_160 ^ uVar7) & local_168._4_4_ ^ uVar7) +
                *(int *)((long)local_140 + lVar3 + 8);
        local_168._0_4_ = uStack_170._4_4_ + iVar5;
        local_178._0_4_ =
             (uVar2 & (uint)uStack_170 ^ (uVar2 ^ (uint)uStack_170) & local_178._4_4_) +
             ((local_178._4_4_ << 10 | local_178._4_4_ >> 0x16) ^
             (local_178._4_4_ << 0x13 | local_178._4_4_ >> 0xd) ^
             (local_178._4_4_ << 0x1e | local_178._4_4_ >> 2)) + iVar5;
        lVar3 = lVar3 + 4;
        uStack_160._4_4_ = uVar7;
        uStack_170._4_4_ = uVar2;
      } while (lVar3 != 0x100);
      uStack_160 = CONCAT44(uVar7,(uint)uStack_160);
      uStack_170 = CONCAT44(uVar2,(uint)uStack_170);
      lVar3 = 0;
      do {
        this->m_h[lVar3] = this->m_h[lVar3] + *(int *)((long)&local_178 + lVar3 * 4);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 8);
      sVar4 = sVar4 + 1;
      puVar6 = puVar6 + 0x40;
    } while (sVar4 != block_nb);
  }
  return;
}

Assistant:

void SHA256::transform(const uint8_t *message, size_t block_nb) {
        uint32_t w[64];
        uint32_t wv[8];
        uint32_t t1, t2;
        const uint8_t *sub_block;
        size_t i;
        size_t j;
        for(i = 0; i < block_nb; ++i) {
            sub_block = message + (i << 6);
            for(j = 0; j < 16; ++j) {
                SHA2_PACK32(&sub_block[j << 2], &w[j]);
            }
            for(j = 16; j < 64; ++j) {
                w[j] =  SHA256_F4(w[j -  2]) + w[j -  7] + SHA256_F3(w[j - 15]) + w[j - 16];
            }
            for(j = 0; j < 8; ++j) {
                wv[j] = m_h[j];
            }
            for(j = 0; j < 64; ++j) {
                t1 = wv[7] + SHA256_F2(wv[4]) + SHA2_CH(wv[4], wv[5], wv[6])
                    + sha256_k[j] + w[j];
                t2 = SHA256_F1(wv[0]) + SHA2_MAJ(wv[0], wv[1], wv[2]);
                wv[7] = wv[6];
                wv[6] = wv[5];
                wv[5] = wv[4];
                wv[4] = wv[3] + t1;
                wv[3] = wv[2];
                wv[2] = wv[1];
                wv[1] = wv[0];
                wv[0] = t1 + t2;
            }
            for(j = 0; j < 8; ++j) {
                m_h[j] += wv[j];
            }
        }
    }